

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::ConflictSet::conflictAnalysis
          (ConflictSet *this,HighsInt *proofinds,double *proofvals,HighsInt prooflen,double proofrhs
          ,HighsConflictPool *conflictPool)

{
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *this_00;
  int iVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer pLVar5;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var6;
  HighsDomain *pHVar7;
  bool bVar8;
  HighsInt HVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  pointer pLVar14;
  vector<double,_std::allocator<double>_> *pvVar15;
  long lVar16;
  pointer __v;
  _Alloc_node __an;
  HighsInt ninfmin;
  HighsCDouble activitymin;
  _Alloc_node local_50;
  int local_44;
  HighsCDouble local_40;
  
  std::
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  ::reserve(&this->resolvedDomainChanges,
            (long)(this->localdom->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->localdom->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4);
  computeMinActivity(this->globaldom,0,prooflen,proofinds,proofvals,&local_44,&local_40);
  if (local_44 == 0) {
    bVar8 = explainInfeasibilityLeq
                      (this,proofinds,proofvals,prooflen,proofrhs,local_40.hi + local_40.lo);
    if (bVar8) {
      HighsPseudocost::increaseConflictWeight
                (&((this->localdom->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->pseudocost);
      __v = (this->resolvedDomainChanges).
            super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pLVar5 = (this->resolvedDomainChanges).
               super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__v != pLVar5) {
        _Var6._M_head_impl =
             (this->localdom->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        pLVar14 = __v;
        do {
          pvVar15 = (vector<double,_std::allocator<double>_> *)
                    ((long)&(_Var6._M_head_impl)->pseudocost + 0xf0);
          if ((pLVar14->domchg).boundtype != kLower) {
            pvVar15 = (vector<double,_std::allocator<double>_> *)
                      ((long)&(_Var6._M_head_impl)->pseudocost + 0x108);
          }
          lVar16 = (long)(pLVar14->domchg).column;
          *(double *)
           (*(long *)&pvVar15->super__Vector_base<double,_std::allocator<double>_> + lVar16 * 8) =
               *(double *)((long)&(_Var6._M_head_impl)->pseudocost + 0x120) +
               *(double *)
                (*(long *)&pvVar15->super__Vector_base<double,_std::allocator<double>_> + lVar16 * 8
                );
          *(double *)((long)&(_Var6._M_head_impl)->pseudocost + 0x128) =
               *(double *)((long)&(_Var6._M_head_impl)->pseudocost + 0x120) +
               *(double *)((long)&(_Var6._M_head_impl)->pseudocost + 0x128);
          pLVar14 = pLVar14 + 1;
        } while (pLVar14 != pLVar5);
      }
      _Var6._M_head_impl =
           (this->localdom->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      uVar11 = ((long)pLVar5 - (long)__v >> 3) * -0x5555555555555552;
      uVar10 = ((long)*(pointer *)((long)&(_Var6._M_head_impl)->integral_cols + 8) -
                *(long *)&((_Var6._M_head_impl)->integral_cols).
                          super__Vector_base<int,_std::allocator<int>_> >> 2) * 3 + 1000;
      if (uVar11 < uVar10 || uVar11 - uVar10 == 0) {
        this_00 = &this->reasonSideFrontier;
        local_50._M_t = &this_00->_M_t;
        if (__v != pLVar5) {
          do {
            std::
            _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
            ::
            _M_insert_unique_<HighsDomain::ConflictSet::LocalDomChg&,std::_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>::_Alloc_node>
                      ((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                        *)this_00,
                       (const_iterator)
                       &(this->reasonSideFrontier)._M_t._M_impl.super__Rb_tree_header,__v,&local_50)
            ;
            __v = __v + 1;
          } while (__v != pLVar5);
        }
        uVar11 = (ulong)((long)(this->localdom->branchPos_).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->localdom->branchPos_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2;
        uVar12 = (uint)uVar11;
        uVar10 = uVar11 & 0xffffffff;
        if (-1 < (int)uVar12) {
          iVar13 = -(uVar12 & 0x7fffffff);
          iVar1 = 0;
          uVar10 = (ulong)(uVar12 & 0x7fffffff);
          do {
            if (uVar10 == 0) {
LAB_0029c6b8:
              HVar9 = computeCuts(this,(HighsInt)uVar10,conflictPool);
              if (HVar9 == -1) {
                uVar11 = (ulong)((int)uVar11 - 1);
                bVar8 = false;
              }
              else {
                iVar1 = iVar1 + HVar9;
                if (iVar1 == 0) {
                  iVar1 = 0;
                  bVar8 = true;
                }
                else {
                  bVar8 = HVar9 == 0 && 3 < (int)uVar11 + iVar13;
                }
              }
              uVar12 = (uint)uVar11;
              if (bVar8) goto LAB_0029c712;
            }
            else {
              pHVar7 = this->localdom;
              iVar4 = (pHVar7->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10 - 1];
              dVar2 = (pHVar7->domchgstack_).
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar4].boundval;
              dVar3 = (pHVar7->prevboundval_).
                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar4].first;
              uVar11 = (ulong)((int)uVar11 - (uint)(dVar2 == dVar3));
              if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) goto LAB_0029c6b8;
            }
            uVar12 = (uint)uVar11;
            iVar13 = iVar13 + 1;
            bVar8 = 0 < (long)uVar10;
            uVar10 = uVar10 - 1;
          } while (bVar8);
          uVar10 = 0xffffffff;
        }
LAB_0029c712:
        if ((uint)uVar10 == uVar12) {
          HighsConflictPool::addConflictCut(conflictPool,this->localdom,this_00);
        }
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::ConflictSet::conflictAnalysis(
    const HighsInt* proofinds, const double* proofvals, HighsInt prooflen,
    double proofrhs, HighsConflictPool& conflictPool) {
  resolvedDomainChanges.reserve(localdom.domchgstack_.size());

  HighsInt ninfmin;
  HighsCDouble activitymin;
  globaldom.computeMinActivity(0, prooflen, proofinds, proofvals, ninfmin,
                               activitymin);
  if (ninfmin != 0) return;

  if (!explainInfeasibilityLeq(proofinds, proofvals, prooflen, proofrhs,
                               double(activitymin)))
    return;

  localdom.mipsolver->mipdata_->pseudocost.increaseConflictWeight();
  for (const LocalDomChg& locdomchg : resolvedDomainChanges) {
    if (locdomchg.domchg.boundtype == HighsBoundType::kLower)
      localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreUp(
          locdomchg.domchg.column);
    else
      localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreDown(
          locdomchg.domchg.column);
  }

  if (10 * resolvedDomainChanges.size() >
      1000 + 3 * localdom.mipsolver->mipdata_->integral_cols.size())
    return;

  reasonSideFrontier.insert(resolvedDomainChanges.begin(),
                            resolvedDomainChanges.end());

  assert(resolvedDomainChanges.size() == reasonSideFrontier.size());

  localdom.mipsolver->mipdata_->debugSolution.checkConflictReasonFrontier(
      reasonSideFrontier, localdom.domchgstack_);

  HighsInt numConflicts = 0;
  HighsInt lastDepth = localdom.branchPos_.size();
  HighsInt currDepth;
  for (currDepth = lastDepth; currDepth >= 0; --currDepth) {
    if (currDepth > 0) {
      // skip redundant branching changes which are just added for symmetry
      // handling
      HighsInt branchpos = localdom.branchPos_[currDepth - 1];
      if (localdom.domchgstack_[branchpos].boundval ==
          localdom.prevboundval_[branchpos].first) {
        --lastDepth;
        continue;
      }
    }
    HighsInt numNewConflicts = computeCuts(currDepth, conflictPool);
    // if the depth level was empty, do not consider it
    if (numNewConflicts == -1) {
      --lastDepth;
      continue;
    }

    numConflicts += numNewConflicts;
    // if no conflict was found in the first non-empty depth level we stop here
    if (numConflicts == 0) break;
    // if no conflict was found in this depth level and all conflicts of the
    // first 5 non-empty depth levels are generated we stop here
    if (lastDepth - currDepth >= 4 && numNewConflicts == 0) break;
  }

  // if we stopped in the highest non-empty depth it means no conflicts where
  // added yet. We want to at least add the current conflict frontier as it
  // means the bound change leading to infeasibility was the last branching
  // itself and hence should have been propagated in the previous depth but was
  // not, e.g. because the threshold for an integral variable was not reached.
  if (currDepth == lastDepth)
    conflictPool.addConflictCut(localdom, reasonSideFrontier);
}